

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

double fct_ts__duration(fct_ts_t *ts)

{
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  double dVar4;
  
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x54e
                  ,"double fct_ts__duration(const fct_ts_t *)");
  }
  sVar1 = (ts->test_list).used_itm_num;
  if (sVar1 == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    sVar3 = 0;
    do {
      pvVar2 = (ts->test_list).itm_list[sVar3];
      if (pvVar2 == (void *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x3f9,"double fct_test__duration(const fct_test_t *)");
      }
      dVar4 = dVar4 + *(double *)((long)pvVar2 + 0x40);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return dVar4;
}

Assistant:

static double
fct_ts__duration(fct_ts_t const *ts)
{
    double tally =0.0;
    FCT_ASSERT( ts != NULL );
    FCT_NLIST_FOREACH_BGN(fct_test_t *, test, &(ts->test_list))
    {
        tally += fct_test__duration(test);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}